

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreCompressedMetaBlockHeader
               (int is_final_block,size_t length,size_t *storage_ix,uint8_t *storage)

{
  ulong *puVar1;
  uint64_t local_180;
  uint64_t nibblesbits;
  size_t nlenbits;
  uint64_t lenbits;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t length_local;
  int is_final_block_local;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  ulong local_b8;
  uint64_t v_1;
  uint8_t *p_1;
  size_t *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  ulong local_88;
  uint64_t v;
  uint8_t *p;
  size_t *local_70;
  long local_68;
  undefined8 local_60;
  ulong local_58;
  ulong *local_50;
  ulong local_48;
  ulong *local_40;
  
  local_68 = (long)is_final_block;
  local_60 = 1;
  v = (uint64_t)(storage + (*storage_ix >> 3));
  local_88 = local_68 << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)v;
  *(ulong *)v = local_88;
  *storage_ix = *storage_ix + 1;
  if (is_final_block != 0) {
    local_90 = 1;
    local_98 = 0;
    v_1 = (uint64_t)(storage + (*storage_ix >> 3));
    local_b8 = 0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)v_1;
    *(ulong *)v_1 = local_b8;
    *storage_ix = *storage_ix + 1;
    p_1 = storage;
    local_a0 = storage_ix;
    local_48 = local_b8;
    local_40 = (ulong *)v_1;
  }
  lenbits = (uint64_t)storage;
  storage_local = (uint8_t *)storage_ix;
  storage_ix_local = (size_t *)length;
  length_local._4_4_ = is_final_block;
  p = storage;
  local_70 = storage_ix;
  local_58 = local_88;
  local_50 = (ulong *)v;
  BrotliEncodeMlen(length,&nlenbits,&nibblesbits,&local_180);
  puVar1 = (ulong *)(lenbits + (*(ulong *)storage_local >> 3));
  *puVar1 = local_180 << ((byte)*(undefined8 *)storage_local & 7) | (ulong)(byte)*puVar1;
  *(long *)storage_local = *(long *)storage_local + 2;
  puVar1 = (ulong *)(lenbits + (*(ulong *)storage_local >> 3));
  *puVar1 = nlenbits << ((byte)*(undefined8 *)storage_local & 7) | (ulong)(byte)*puVar1;
  *(uint64_t *)storage_local = nibblesbits + *(long *)storage_local;
  if (length_local._4_4_ == 0) {
    puVar1 = (ulong *)(lenbits + (*(ulong *)storage_local >> 3));
    *puVar1 = 0L << ((byte)*(undefined8 *)storage_local & 7) | (ulong)(byte)*puVar1;
    *(long *)storage_local = *(long *)storage_local + 1;
  }
  return;
}

Assistant:

static void StoreCompressedMetaBlockHeader(BROTLI_BOOL is_final_block,
                                           size_t length,
                                           size_t* storage_ix,
                                           uint8_t* storage) {
  uint64_t lenbits;
  size_t nlenbits;
  uint64_t nibblesbits;

  /* Write ISLAST bit. */
  BrotliWriteBits(1, (uint64_t)is_final_block, storage_ix, storage);
  /* Write ISEMPTY bit. */
  if (is_final_block) {
    BrotliWriteBits(1, 0, storage_ix, storage);
  }

  BrotliEncodeMlen(length, &lenbits, &nlenbits, &nibblesbits);
  BrotliWriteBits(2, nibblesbits, storage_ix, storage);
  BrotliWriteBits(nlenbits, lenbits, storage_ix, storage);

  if (!is_final_block) {
    /* Write ISUNCOMPRESSED bit. */
    BrotliWriteBits(1, 0, storage_ix, storage);
  }
}